

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Client * __thiscall
kj::_::NullableValue<capnproto_test::capnp::test::TestInterface::Client>::
emplace<capnproto_test::capnp::test::TestInterface::Client>
          (NullableValue<capnproto_test::capnp::test::TestInterface::Client> *this,Client *params)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  undefined8 uVar3;
  
  if (this->isSet == true) {
    this->isSet = false;
    Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)((long)&this->field_1 + 8));
  }
  p_Var2 = params->_vptr_Client[-3];
  p_Var1 = (_func_int *)((long)&params->_vptr_Client + (long)p_Var2);
  uVar3 = *(undefined8 *)(p_Var1 + 8);
  *(undefined8 *)((long)&this->field_1 + 8) = *(undefined8 *)p_Var1;
  *(undefined8 *)((long)&this->field_1 + 0x10) = uVar3;
  *(undefined8 *)(&params->field_0x8 + (long)p_Var2) = 0;
  (this->field_1).value._vptr_Client = (_func_int **)&capnp::Capability::Client::typeinfo;
  this->isSet = true;
  return (Client *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }